

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  undefined8 uVar1;
  array<float,_4> aVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  Float FVar8;
  Float FVar9;
  Float FVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar23 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  SampledSpectrum SVar35;
  Vector3<float> VVar36;
  Vector3<float> local_b8;
  SampledSpectrum local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  SampledSpectrum local_50;
  Tuple3<pbrt::Normal3,_float> local_40;
  undefined1 auVar30 [60];
  undefined1 auVar31 [56];
  
  auVar34._4_60_ = wi._12_60_;
  auVar34._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar33._8_56_ = wi._8_56_;
  auVar33._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._4_60_ = wo._12_60_;
  auVar25._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._8_56_ = wo._8_56_;
  auVar16._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_88._0_8_ = vmovlps_avx(auVar16._0_16_);
  local_98._0_8_ = vmovlps_avx(auVar33._0_16_);
  auVar7 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                      ZEXT416((uint)(this->mfDistrib).alpha_x));
  local_98.z = auVar34._0_4_;
  local_88.z = auVar25._0_4_;
  if (0.001 <= auVar7._0_4_) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = ZEXT812(0);
    this_00 = &this->mfDistrib;
    if (auVar25._0_4_ * auVar34._0_4_ <= 0.0) {
      if (((auVar25._0_4_ != 0.0) || (NAN(auVar25._0_4_))) &&
         ((auVar34._0_4_ != 0.0 || (NAN(auVar34._0_4_))))) {
        local_68._0_4_ = auVar25._0_4_ * auVar34._0_4_;
        uVar1 = vcmpss_avx512f(auVar7 << 0x20,auVar25._0_16_,1);
        bVar4 = (bool)((byte)uVar1 & 1);
        local_78._0_4_ = (uint)bVar4 * (int)this->eta + (uint)!bVar4 * (int)(1.0 / this->eta);
        local_78._4_12_ = SUB6012((undefined1  [60])0x0,0);
        local_b8.super_Tuple3<pbrt::Vector3,_float>.z =
             (float)local_78._0_4_ * auVar34._0_4_ + auVar25._0_4_;
        auVar13._0_4_ =
             (float)local_78._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x +
             wo.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar13._4_4_ =
             (float)local_78._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y +
             wo.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar13._8_4_ =
             (float)local_78._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z +
             wo.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar13._12_4_ = (float)local_78._0_4_ * wi._12_4_ + wo._12_4_;
        uVar1 = vmovlps_avx(auVar13);
        local_b8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
        local_b8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
        if ((f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
           (iVar6 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg), iVar6 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                     f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                     StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg
                             );
        }
        *(long *)(in_FS_OFFSET + -0xe0) = *(long *)(in_FS_OFFSET + -0xe0) + 1;
        auVar14._0_4_ =
             local_b8.super_Tuple3<pbrt::Vector3,_float>.y *
             local_b8.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar14._4_4_ =
             local_b8.super_Tuple3<pbrt::Vector3,_float>.z *
             local_b8.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar14._8_8_ = 0;
        auVar7 = vmovshdup_avx(auVar14);
        fVar24 = local_b8.super_Tuple3<pbrt::Vector3,_float>.x *
                 local_b8.super_Tuple3<pbrt::Vector3,_float>.x + auVar14._0_4_ + auVar7._0_4_;
        auVar23 = (undefined1  [56])0x0;
        auVar30 = SUB6460(ZEXT864(0),0);
        if ((fVar24 != 0.0) || (NAN(fVar24))) {
          VVar36 = Normalize<float>(&local_b8);
          local_50.values.values[2] = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar20._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar20._8_56_ = auVar23;
          local_40.x = 0.0;
          local_40.y = 0.0;
          local_50.values.values._0_8_ = vmovlps_avx(auVar20._0_16_);
          local_40.z = 1.0;
          VVar36 = FaceForward<float>((Vector3<float> *)&local_50,(Normal3<float> *)&local_40);
          auVar28._0_4_ = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar28._4_60_ = auVar30;
          auVar21._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar21._8_56_ = auVar23;
          auVar14 = auVar21._0_16_;
          uVar1 = vmovlps_avx(auVar14);
          local_b8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
          local_b8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
          auVar7 = vmovshdup_avx(auVar14);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_98.y)),auVar14,
                                    ZEXT416((uint)local_98.x));
          auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_88.y)),auVar14,
                                   ZEXT416((uint)local_88.x));
          auVar13 = vfmadd231ss_fma(auVar13,auVar28._0_16_,ZEXT416((uint)local_98.z));
          auVar7 = vfmadd231ss_fma(auVar7,auVar28._0_16_,ZEXT416((uint)local_88.z));
          if (auVar13._0_4_ * auVar7._0_4_ <= 0.0) {
            local_b8.super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_;
            FVar8 = FrDielectric(auVar7._0_4_,this->eta);
            auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                   local_88.y)),
                                     ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.x),
                                     ZEXT416((uint)local_88.x));
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.super_Tuple3<pbrt::Vector3,_float>.y *
                                                    local_98.y)),
                                      ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.x),
                                      ZEXT416((uint)local_98.x));
            auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_b8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                     ZEXT416((uint)local_88.z));
            auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_b8.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                      ZEXT416((uint)local_98.z));
            auVar7 = vfmadd213ss_fma(auVar13,local_78,auVar7);
            fVar24 = 1.0 / local_78._0_4_;
            local_78._0_4_ =
                 (float)((uint)(mode == Radiance) * (int)(fVar24 * fVar24) +
                        (uint)(mode != Radiance) * 0x3f800000) * (1.0 - FVar8);
            FVar8 = TrowbridgeReitzDistribution::D(this_00,&local_b8);
            FVar9 = TrowbridgeReitzDistribution::G
                              (this_00,(Vector3f *)&local_88,(Vector3f *)&local_98);
            fVar24 = AbsDot<float>((Vector3<float> *)&local_98,&local_b8);
            fVar11 = AbsDot<float>((Vector3<float> *)&local_88,&local_b8);
            auVar31 = (undefined1  [56])0x0;
            auVar15._0_4_ =
                 (fVar11 * fVar24 * FVar9 * FVar8) /
                 (auVar7._0_4_ * auVar7._0_4_ * (float)local_68._0_4_);
            auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar7 = vandps_avx512vl(auVar15,auVar5);
            auVar23 = (undefined1  [56])0x0;
            SampledSpectrum::SampledSpectrum(&local_50,auVar7._0_4_ * (float)local_78._0_4_);
            SVar35 = SampledSpectrum::operator*(&this->tint,&local_50);
            auVar29._0_8_ = SVar35.values.values._8_8_;
            auVar29._8_56_ = auVar31;
            auVar22._0_8_ = SVar35.values.values._0_8_;
            auVar22._8_56_ = auVar23;
            aVar2.values = (float  [4])vmovlhps_avx(auVar22._0_16_,auVar29._0_16_);
            return (SampledSpectrum)(array<float,_4>)aVar2.values;
          }
        }
        else {
          *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
        }
      }
      local_a8.values.values = (array<float,_4>)ZEXT816(0);
      return (array<float,_4>)local_a8.values.values;
    }
    auVar32._0_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.x + wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar32._4_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.y + wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar32._8_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.z + wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._12_4_ = wi._12_4_ + wo._12_4_;
    local_b8.super_Tuple3<pbrt::Vector3,_float>.z = auVar25._0_4_ + auVar34._0_4_;
    uVar1 = vmovlps_avx(auVar32);
    local_b8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
    local_b8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
    if ((((auVar25._0_4_ != 0.0) || (NAN(auVar25._0_4_))) &&
        ((auVar34._0_4_ != 0.0 || (NAN(auVar34._0_4_))))) &&
       ((((uVar3 = vcmpps_avx512vl(auVar32,ZEXT416(0) << 0x20,0), (uVar3 & 1) == 0 ||
          ((uVar3 >> 1 & 1) == 0)) || (local_b8.super_Tuple3<pbrt::Vector3,_float>.z != 0.0)) ||
        (NAN(local_b8.super_Tuple3<pbrt::Vector3,_float>.z))))) {
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      local_68 = vandps_avx(auVar25._0_16_,auVar12);
      auVar30 = ZEXT1260(local_68._4_12_);
      local_78 = vandps_avx(auVar34._0_16_,auVar12);
      auVar23 = ZEXT856(local_78._8_8_);
      VVar36 = Normalize<float>(&local_b8);
      local_b8.super_Tuple3<pbrt::Vector3,_float>.z = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar23;
      uVar1 = vmovlps_avx(auVar17._0_16_);
      local_b8.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
      local_b8.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
      local_50.values.values[0] = 0.0;
      local_50.values.values[1] = 0.0;
      local_50.values.values[2] = 1.0;
      VVar36 = FaceForward<float>(&local_b8,(Vector3<float> *)&local_50);
      auVar26._0_4_ = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._4_60_ = auVar30;
      auVar18._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar23;
      auVar7 = vmovshdup_avx(auVar18._0_16_);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * local_98.y)),auVar18._0_16_,
                               ZEXT416((uint)local_98.x));
      auVar7 = vfmadd231ss_fma(auVar7,auVar26._0_16_,ZEXT416((uint)local_98.z));
      FVar8 = FrDielectric(auVar7._0_4_,this->eta);
      FVar9 = TrowbridgeReitzDistribution::D(this_00,&local_b8);
      FVar10 = TrowbridgeReitzDistribution::G(this_00,(Vector3f *)&local_88,(Vector3f *)&local_98);
      auVar31 = (undefined1  [56])0x0;
      auVar23 = ZEXT856(0);
      SampledSpectrum::SampledSpectrum
                (&local_50,
                 (FVar10 * FVar9 * FVar8) / ((float)local_78._0_4_ * 4.0 * (float)local_68._0_4_));
      SVar35 = SampledSpectrum::operator*(&this->tint,&local_50);
      auVar27._0_8_ = SVar35.values.values._8_8_;
      auVar27._8_56_ = auVar31;
      auVar19._0_8_ = SVar35.values.values._0_8_;
      auVar19._8_56_ = auVar23;
      aVar2.values = (float  [4])vmovlhps_avx(auVar19._0_16_,auVar27._0_16_);
      return (SampledSpectrum)(array<float,_4>)aVar2.values;
    }
  }
  SampledSpectrum::SampledSpectrum(&local_a8,0.0);
  return (array<float,_4>)(array<float,_4>)local_a8;
}

Assistant:

SampledSpectrum DielectricInterfaceBxDF::f(Vector3f wo, Vector3f wi,
                                           TransportMode mode) const {
    if (mfDistrib.EffectivelySmooth())
        return SampledSpectrum(0);
    if (SameHemisphere(wo, wi)) {
        // Compute reflection at non-delta dielectric interface
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return SampledSpectrum(0.);
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return SampledSpectrum(0.);
        wh = Normalize(wh);
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        return tint * SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                      (4 * cosTheta_i * cosTheta_o));

    } else {
        // Compute transmission at non-delta dielectric interface
        Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return {};
        wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

        // Return no transmission if _wi_ and _wo_ are on the same side of _wh_
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return {};

        // Evaluate BTDF for transmission through microfacet interface
        Float F = FrDielectric(Dot(wo, wh), eta);
        Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
        Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
        return tint *
               SampledSpectrum((1 - F) * factor *
                               std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                        AbsDot(wi, wh) * AbsDot(wo, wh) /
                                        (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
    }
}